

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

void aspa_table_free(aspa_table *aspa_table,_Bool notify)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &aspa_table->update_lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  while (aspa_table->store != (aspa_store_node *)0x0) {
    aspa_table_remove_node(aspa_table,&aspa_table->store,notify);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  pthread_rwlock_destroy((pthread_rwlock_t *)aspa_table);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT void aspa_table_free(struct aspa_table *aspa_table, bool notify)
{
	pthread_rwlock_wrlock(&aspa_table->update_lock);
	pthread_rwlock_wrlock(&aspa_table->lock);

	// Free store
	while (aspa_table->store)
		aspa_table_remove_node(aspa_table, &aspa_table->store, notify);

	aspa_table->store = NULL;

	pthread_rwlock_unlock(&aspa_table->lock);
	pthread_rwlock_destroy(&aspa_table->lock);
	pthread_rwlock_unlock(&aspa_table->update_lock);
	pthread_rwlock_destroy(&aspa_table->update_lock);
}